

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

void do_dw(int *ip)

{
  char cVar1;
  int iVar2;
  t_symbol *ptVar3;
  int iVar4;
  char *stptr;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  data_size = 2;
  data_level = 2;
  do {
    iVar4 = evaluate(ip,'\0');
    iVar2 = loccnt;
    if (iVar4 == 0) {
      return;
    }
    loccnt = loccnt + 2;
    if (pass == 1) {
      if (value - 0x10000 < 0xfffe8000) {
        stptr = "Overflow error!";
        goto LAB_0010a33f;
      }
      putword(iVar2,value);
    }
    iVar2 = *ip;
    *ip = iVar2 + 1;
    ptVar3 = lablptr;
    cVar1 = prlnbuf[iVar2];
  } while (cVar1 == ',');
  if ((cVar1 == '\0') || (cVar1 == ';')) {
    if (lablptr == (t_symbol *)0x0) {
      if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 0)) {
        lastlabl->data_size = lastlabl->data_size + (loccnt - data_loccnt);
      }
    }
    else {
      lablptr->data_type = 0;
      ptVar3->data_size = loccnt - data_loccnt;
    }
    if (pass != 1) {
      return;
    }
    println();
    return;
  }
  stptr = "Syntax error!";
LAB_0010a33f:
  error(stptr);
  return;
}

Assistant:

void
do_dw(int *ip)
{
	char c;

	/* define label */
	labldef(loccnt, 1);

	/* output infos */
	data_loccnt = loccnt;
	data_size   = 2;
	data_level  = 2;

	/* get data */
	for (;;) {
		/* get a word */
		if (!evaluate(ip, 0))
			return;

		/* update location counter */
		loccnt += 2;

		/* store word on last pass */
		if (pass == LAST_PASS) {
			/* check for overflow */
			if ((value > 0xFFFF) && (value < 0xFFFF8000)) {
				error("Overflow error!");
				return;
			}

			/* store word */
			putword(loccnt-2, value);
		}

		/* check if there's another word */
		c = prlnbuf[(*ip)++];

		if (c != ',')
			break;
	}

	/* check error */
	if (c != ';' && c != '\0') {
		error("Syntax error!");
		return;
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_DB;
		lablptr->data_size = loccnt - data_loccnt;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_DB)
				lastlabl->data_size += loccnt - data_loccnt;
		}
	}

	/* output line */
	if (pass == LAST_PASS)
		println();
}